

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

EndpointDeclaration * __thiscall
soul::PoolAllocator::
allocate<soul::AST::EndpointDeclaration,soul::AST::Allocator&,soul::AST::Context,bool&,soul::EndpointType&>
          (PoolAllocator *this,Allocator *args,Context *args_1,bool *args_2,EndpointType *args_3)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_41;
  EndpointDeclaration *local_40;
  EndpointDeclaration *newObject;
  PoolItem *newItem;
  EndpointType *args_local_3;
  bool *args_local_2;
  Context *args_local_1;
  Allocator *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_3;
  args_local_3 = (EndpointType *)args_2;
  args_local_2 = (bool *)args_1;
  args_local_1 = (Context *)args;
  args_local = (Allocator *)this;
  newObject = (EndpointDeclaration *)allocateSpaceForObject(this,0x78);
  this_00 = &(newObject->super_ASTObject).context;
  AST::EndpointDeclaration::EndpointDeclaration
            ((EndpointDeclaration *)this_00,(Allocator *)args_local_1,(Context *)args_local_2,
             (bool)((char)*args_local_3 & stream),(EndpointType)newItem->size);
  local_40 = (EndpointDeclaration *)this_00;
  pDVar1 = allocate(soul::AST::Allocator&,soul::AST::Context&&,bool&,soul::EndpointType&)::
           {lambda(void*)#1}::operator_cast_to_function_pointer(&local_41);
  *(DestructorFn **)&(newObject->super_ASTObject).objectType = pDVar1;
  return local_40;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }